

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UtestPlatform.cpp
# Opt level: O1

int PlatformSpecificSetJmpImplementation(_func_void_void_ptr *function,void *data)

{
  int iVar1;
  
  iVar1 = _setjmp((__jmp_buf_tag *)(test_exit_jmp_buf + jmp_buf_index));
  if (iVar1 == 0) {
    jmp_buf_index = jmp_buf_index + 1;
    (*function)(data);
    jmp_buf_index = jmp_buf_index + -1;
  }
  return (int)(iVar1 == 0);
}

Assistant:

static int PlatformSpecificSetJmpImplementation(void (*function) (void* data), void* data)
{
    if (0 == setjmp(test_exit_jmp_buf[jmp_buf_index])) {
        jmp_buf_index++;
        function(data);
        jmp_buf_index--;
        return 1;
    }
    return 0;
}